

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairness_test.cpp
# Opt level: O2

void __thiscall
TaskFairSharedMutexTest_TaskFifoSched_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>
::~TaskFairSharedMutexTest_TaskFifoSched_Test
          (TaskFairSharedMutexTest_TaskFifoSched_Test<yamc::fair::basic_shared_mutex<yamc::rwlock::TaskFairness>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(TaskFairSharedMutexTest, TaskFifoSched)
{
  SETUP_STEPTEST;
  yamc::test::phaser phaser(5);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(5, [&](std::size_t id) {
    auto ph = phaser.get(id);
    switch (id) {
    case 0:
      mtx.lock();
      ph.advance(1);  // p1
      EXPECT_STEP(1);
      ph.advance(1);  // p2
      EXPECT_STEP(2);
      ph.advance(1);  // p3
      EXPECT_STEP(3);
      ph.advance(1);  // p4
      mtx.unlock();
      break;
    case 1:
      ph.await();     // p1
      ph.advance(2);  // p2-3
      mtx.lock_shared();
      ph.await();     // p4
      EXPECT_STEP(5);
      mtx.unlock_shared();
      break;
    case 2:
      ph.await();     // p1
      ph.advance(2);  // p2-3
      mtx.lock_shared();
      EXPECT_STEP(4);
      mtx.unlock_shared();
      ph.await();     // p4
      mtx.lock_shared();
      EXPECT_STEP_RANGE(7, 8);
      mtx.unlock_shared();
      break;
    case 3:
      ph.advance(1);  // p1
      ph.await();     // p2
      ph.advance(2);  // p3-4
      mtx.lock();
      EXPECT_STEP(6);
      mtx.unlock();
      break;
    case 4:
      ph.advance(2);  // p1-2
      ph.await();     // p3
      ph.advance(1);  // p4
      mtx.lock_shared();
      EXPECT_STEP_RANGE(7, 8);
      mtx.unlock_shared();
      break;
    }
  });
  EXPECT_LE(TEST_TICKS * 7, sw.elapsed());
}